

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

Bigint * Balloc(int k)

{
  int iVar1;
  ulong uVar2;
  Bigint *pBStack_18;
  uint len;
  Bigint *rv;
  int x;
  int k_local;
  
  if ((k < 8) && (pBStack_18 = TI0.Freelist[k], pBStack_18 != (Bigint *)0x0)) {
    TI0.Freelist[k] = pBStack_18->next;
  }
  else {
    iVar1 = 1 << ((byte)k & 0x1f);
    uVar2 = (long)(iVar1 + -1) * 4 + 0x27U >> 3;
    if ((k < 8) && (((long)(pmem_next + -0x26e82) >> 3) + (uVar2 & 0xffffffff) < 0x121)) {
      pBStack_18 = (Bigint *)pmem_next;
      pmem_next = pmem_next + (uVar2 & 0xffffffff);
    }
    else {
      pBStack_18 = (Bigint *)malloc((uVar2 & 0xffffffff) << 3);
    }
    pBStack_18->k = k;
    pBStack_18->maxwds = iVar1;
  }
  pBStack_18->wds = 0;
  pBStack_18->sign = 0;
  return pBStack_18;
}

Assistant:

static Bigint *
Balloc(int k MTd)
{
	int x;
	Bigint *rv;
#ifndef Omit_Private_Memory
	unsigned int len;
#endif
#ifdef MULTIPLE_THREADS
	ThInfo *TI;

	if (!(TI = *PTI))
		*PTI = TI = get_TI();
	if (TI == &TI0)
		ACQUIRE_DTOA_LOCK(0);
#endif
	/* The k > Kmax case does not need ACQUIRE_DTOA_LOCK(0), */
	/* but this case seems very unlikely. */
	if (k <= Kmax && (rv = freelist[k]))
		freelist[k] = rv->next;
	else {
		x = 1 << k;
#ifdef Omit_Private_Memory
		rv = (Bigint *)MALLOC(sizeof(Bigint) + (x-1)*sizeof(ULong));
#else
		len = (sizeof(Bigint) + (x-1)*sizeof(ULong) + sizeof(double) - 1)
			/sizeof(double);
		if (k <= Kmax && pmem_next - private_mem + len <= PRIVATE_mem
#ifdef MULTIPLE_THREADS
			&& TI == TI1
#endif
			) {
			rv = (Bigint*)pmem_next;
			pmem_next += len;
			}
		else
			rv = (Bigint*)MALLOC(len*sizeof(double));
#endif
		rv->k = k;
		rv->maxwds = x;
		}
#ifdef MULTIPLE_THREADS
	if (TI == &TI0)
		FREE_DTOA_LOCK(0);
#endif
	rv->sign = rv->wds = 0;
	return rv;
	}